

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FPolyObj *poly,FPolyObj *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  TAngle<double> local_48;
  undefined1 local_40 [8];
  DVector2 delta;
  DAngle angle;
  FPolyObj *def_local;
  FPolyObj *poly_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    TAngle<double>::TAngle((TAngle<double> *)&delta.Y,&poly->Angle);
    TVector2<double>::TVector2((TVector2<double> *)local_40,&(poly->StartSpot).pos);
    pFVar2 = FSerializer::operator()(arc,"angle",(TAngle<double> *)&delta.Y);
    pFVar2 = FSerializer::operator()(pFVar2,"pos",(TVector2<double> *)local_40);
    pFVar2 = FSerializer::operator()(pFVar2,"interpolation",&poly->interpolation);
    pFVar2 = FSerializer::operator()(pFVar2,"blocked",&poly->bBlocked);
    pFVar2 = FSerializer::operator()(pFVar2,"hasportals",&poly->bHasPortals);
    pFVar2 = FSerializer::operator()(pFVar2,"specialdata",&poly->specialdata);
    FSerializer::EndObject(pFVar2);
    bVar1 = FSerializer::isReading(arc);
    if (bVar1) {
      TAngle<double>::TAngle(&local_48,(TAngle<double> *)&delta.Y);
      FPolyObj::RotatePolyobj(poly,&local_48,true);
      TVector2<double>::operator-=((TVector2<double> *)local_40,&(poly->StartSpot).pos);
      FPolyObj::MovePolyobj(poly,(DVector2 *)local_40,true);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FPolyObj &poly, FPolyObj *def)
{
	if (arc.BeginObject(key))
	{
		DAngle angle = poly.Angle;
		DVector2 delta = poly.StartSpot.pos;
		arc("angle", angle)
			("pos", delta)
			("interpolation", poly.interpolation)
			("blocked", poly.bBlocked)
			("hasportals", poly.bHasPortals)
			("specialdata", poly.specialdata)
			.EndObject();

		if (arc.isReading())
		{
			poly.RotatePolyobj(angle, true);
			delta -= poly.StartSpot.pos;
			poly.MovePolyobj(delta, true);
		}
	}
	return arc;
}